

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

void __thiscall Board::print(Board *this,uint moves)

{
  byte bVar1;
  uint __val;
  ostream *poVar2;
  byte *pbVar3;
  dimension y_1;
  dimension y;
  byte bVar4;
  ulong uVar5;
  ulong local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<(poVar2,"--= Board =--");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"  ");
  for (bVar4 = 0; bVar4 < this->m_height; bVar4 = bVar4 + 1) {
    print_index(bVar4);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  __val = 99;
  if ((int)moves < 99) {
    __val = moves;
  }
  for (local_b0 = 0; local_b0 < this->m_width; local_b0 = local_b0 + 1) {
    print_index((dimension)local_b0);
    for (uVar5 = 0; uVar5 < this->m_height; uVar5 = uVar5 + 1) {
      if (*(char *)(*(long *)&(this->m_board).
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_b0].
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data + uVar5) == 'j') {
        std::operator<<((ostream *)&std::cout,"\x1b[1mJK\x1b[0m");
      }
      else {
        bVar4 = (this->m_position).first;
        bVar1 = (this->m_position).second;
        poVar2 = std::operator<<((ostream *)&std::cout,"\x1b[");
        if ((local_b0 == bVar4) && (uVar5 == bVar1)) {
          pbVar3 = std::
                   map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
                   ::at(&color_codes,
                        (key_type *)
                        (*(long *)&(this->m_board).
                                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[local_b0].
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data + uVar5));
          std::__cxx11::to_string(&local_90,*pbVar3 + 0x1e);
          poVar2 = std::operator<<(poVar2,(string *)&local_90);
          poVar2 = std::operator<<(poVar2,"m");
          std::__cxx11::to_string(&local_70,__val);
          zfill(&local_50,&local_70,2,'0');
          poVar2 = std::operator<<(poVar2,(string *)&local_50);
          std::operator<<(poVar2,"\x1b[0m");
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
        }
        else {
          pbVar3 = std::
                   map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
                   ::at(&color_codes,
                        (key_type *)
                        (*(long *)&(this->m_board).
                                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[local_b0].
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data + uVar5));
          std::__cxx11::to_string(&local_90,*pbVar3 + 0x28);
          poVar2 = std::operator<<(poVar2,(string *)&local_90);
          std::operator<<(poVar2,"m  \x1b[0m");
          std::__cxx11::string::~string((string *)&local_90);
        }
      }
    }
    print_index((dimension)local_b0);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  std::operator<<((ostream *)&std::cout,"  ");
  for (bVar4 = 0; bVar4 < this->m_height; bVar4 = bVar4 + 1) {
    print_index(bVar4);
  }
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void Board::print(const unsigned int moves) const {
    // Display title.
    cout << endl << "--= Board =--" << endl;

    // Display upper indexes (X axis).
    cout << "  ";
    for (dimension y = 0; y < m_height; y++) print_index(y);
    cout << endl;

    // Display board.
    for (dimension x = 0; x < m_width; x++) {
        // Display left index (Y axis).
        print_index(x);
        for (dimension y = 0; y < m_height; y++) {
            if (m_board[x][y] == joker) {
                // Display joker.
                cout << "\033[1mJK\033[0m";
            } else if ((x == m_position.first) && (y == m_position.second)) {
                // Display base position.
                cout << "\033[" << to_string(color_codes.at(m_board[x][y]) + foreground_color_code) << "m"
                     << zfill(to_string(min((int) moves, 99)), 2, '0') << "\033[0m";
            } else {
                // Display color.
                cout << "\033[" << to_string(color_codes.at(m_board[x][y]) + background_color_code) << "m  \033[0m";
            }
        }
        // Display right index (Y axis).
        print_index(x);
        cout << endl;
    }

    // Display lower indexes (X axis).
    cout << "  ";
    for (dimension y = 0; y < m_height; y++) print_index(y);
    cout << endl << endl;
}